

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysp_ident_free(lysf_ctx *ctx,lysp_ident *ident)

{
  lysp_ext_instance *local_60;
  char *local_50;
  ulong local_40;
  lysp_ext_instance *local_30;
  uint64_t c___2;
  uint64_t c___1;
  uint64_t c__;
  lysp_ident *ident_local;
  lysf_ctx *ctx_local;
  
  lydict_remove(ctx->ctx,ident->name);
  c___1 = 0;
  while( true ) {
    if (ident->iffeatures == (lysp_qname *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = *(ulong *)&ident->iffeatures[-1].flags;
    }
    if (local_40 <= c___1) break;
    lysp_qname_free(ctx->ctx,ident->iffeatures + c___1);
    c___1 = c___1 + 1;
  }
  if (ident->iffeatures != (lysp_qname *)0x0) {
    free(&ident->iffeatures[-1].flags);
  }
  c___2 = 0;
  while( true ) {
    if (ident->bases == (char **)0x0) {
      local_50 = (char *)0x0;
    }
    else {
      local_50 = ident->bases[-1];
    }
    if (local_50 <= c___2) break;
    lydict_remove(ctx->ctx,ident->bases[c___2]);
    c___2 = c___2 + 1;
  }
  if (ident->bases != (char **)0x0) {
    free(ident->bases + -1);
  }
  lydict_remove(ctx->ctx,ident->dsc);
  lydict_remove(ctx->ctx,ident->ref);
  local_30 = (lysp_ext_instance *)0x0;
  while( true ) {
    if (ident->exts == (lysp_ext_instance *)0x0) {
      local_60 = (lysp_ext_instance *)0x0;
    }
    else {
      local_60 = ident->exts[-1].exts;
    }
    if (local_60 <= local_30) break;
    lysp_ext_instance_free(ctx,ident->exts + (long)local_30);
    local_30 = (lysp_ext_instance *)((long)&local_30->name + 1);
  }
  if (ident->exts != (lysp_ext_instance *)0x0) {
    free(&ident->exts[-1].exts);
  }
  return;
}

Assistant:

static void
lysp_ident_free(struct lysf_ctx *ctx, struct lysp_ident *ident)
{
    lydict_remove(ctx->ctx, ident->name);
    FREE_ARRAY(ctx->ctx, ident->iffeatures, lysp_qname_free);
    FREE_STRINGS(ctx->ctx, ident->bases);
    lydict_remove(ctx->ctx, ident->dsc);
    lydict_remove(ctx->ctx, ident->ref);
    FREE_ARRAY(ctx, ident->exts, lysp_ext_instance_free);
}